

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::createSlicePlaneFliterRule
          (GLEngine *this,string *uniquePostfix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pointer pcVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  pointer pSVar7;
  __hashtable *__h;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  ShaderReplacementRule local_170;
  string local_f0;
  char *local_d0;
  size_type local_c8;
  char local_c0 [8];
  undefined8 uStack_b8;
  char *local_b0;
  size_type local_a8;
  char local_a0 [8];
  undefined8 uStack_98;
  undefined1 local_90 [48];
  undefined1 auStack_60 [24];
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  vStack_48;
  undefined1 auVar10 [64];
  
  std::operator+(&local_190,"SLICE_PLANE_CULL_",uniquePostfix);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  pcVar4 = (uniquePostfix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar4,pcVar4 + uniquePostfix->_M_string_length);
  generateSlicePlaneRule(&local_170,&local_f0);
  pSVar7 = local_170.attributes.
           super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p == &local_190.field_2) {
    uStack_b8 = local_190.field_2._8_8_;
    local_d0 = local_c0;
  }
  else {
    local_d0 = local_190._M_dataplus._M_p;
  }
  local_c8 = local_190._M_string_length;
  local_190._M_string_length = 0;
  local_190.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_170.ruleName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.ruleName._M_dataplus._M_p == paVar1) {
    uStack_98 = local_170.ruleName.field_2._8_8_;
    local_b0 = local_a0;
  }
  else {
    local_b0 = local_170.ruleName._M_dataplus._M_p;
  }
  local_a8 = local_170.ruleName._M_string_length;
  local_170.ruleName._M_string_length = 0;
  local_170.ruleName.field_2._M_local_buf[0] = '\0';
  auVar8._8_8_ = local_170.replacements.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auVar8._0_8_ = local_170.replacements.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  auVar8._16_8_ =
       local_170.replacements.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar8._24_8_ =
       local_170.uniforms.
       super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar8._32_8_ =
       local_170.uniforms.
       super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auVar8._40_8_ =
       local_170.uniforms.
       super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar8._48_8_ =
       local_170.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar8._56_8_ =
       local_170.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auVar8 = vmovdqu64_avx512f(auVar8);
  local_170.replacements.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_170.replacements.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_170.replacements.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar9 = vpbroadcastq_avx512f(auVar2);
  auVar10._0_16_ = auVar8._0_16_;
  auVar10._16_8_ = auVar9._16_8_;
  auVar10._24_8_ = auVar8._24_8_;
  auVar10._32_8_ = auVar8._32_8_;
  auVar10._40_8_ = auVar8._40_8_;
  auVar10._48_8_ = auVar8._48_8_;
  auVar10._56_8_ = auVar8._56_8_;
  local_170.replacements.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar8 = vpmovsxbq_avx512f(ZEXT816(0x908020100));
  auVar9._8_8_ = local_170.uniforms.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auVar9._0_8_ = local_170.uniforms.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  auVar9._16_8_ =
       local_170.uniforms.
       super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar9._24_8_ =
       local_170.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar9._32_8_ =
       local_170.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auVar9._40_8_ =
       local_170.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar9._48_8_ =
       local_170.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar9._56_8_ =
       local_170.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auVar8 = vpermi2q_avx512f(auVar8,auVar10,auVar9);
  local_170.uniforms.
  super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_170.uniforms.
  super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_170.uniforms.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar9 = vpbroadcastq_avx512f(auVar3);
  auVar11._0_40_ = auVar8._0_40_;
  auVar11._40_8_ = auVar9._40_8_;
  auVar11._48_8_ = auVar8._48_8_;
  auVar11._56_8_ = auVar8._56_8_;
  local_170.uniforms.
  super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar6._8_8_ = local_170.attributes.
                 super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auVar6._0_8_ = local_170.attributes.
                 super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  auVar8 = vinserti32x4_avx512f(auVar11,auVar6,3);
  _local_90 = vmovdqu64_avx512f(auVar8);
  local_170.attributes.
  super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170.attributes.
  super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_170.attributes.
  super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar5 = vpermpd_avx2(ZEXT1632(CONCAT88(local_170.textures.
                                          super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,
                                          local_170.textures.
                                          super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                                          ._M_impl.super__Vector_impl_data._M_start)),0xd0);
  auVar5 = vblendps_avx(auVar5,ZEXT832(pSVar7),3);
  auVar12._8_8_ =
       local_170.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar12._0_8_ =
       local_170.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar12._16_8_ =
       local_170.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar12._24_8_ =
       local_170.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  unique0x000ebc80 = vblendps_avx(auVar5,auVar12,0xc0);
  local_170.textures.
  super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_170.textures.
  super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170.textures.
  super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  local_170.ruleName._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->registeredShaderRules);
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector(&vStack_48);
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)(local_90 + 0x30));
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
             *)(local_90 + 0x18));
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_90);
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector(&local_170.textures);
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector(&local_170.attributes);
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_170.uniforms);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_170.replacements);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.ruleName._M_dataplus._M_p != paVar1) {
    operator_delete(local_170.ruleName._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  return;
}

Assistant:

void GLEngine::createSlicePlaneFliterRule(std::string uniquePostfix) {
  registeredShaderRules.insert({"SLICE_PLANE_CULL_" + uniquePostfix, generateSlicePlaneRule(uniquePostfix)});
}